

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

Territory findMatch(int parentNumber,char *territoryISO)

{
  bool bVar1;
  int iVar2;
  char **local_48;
  AlphaRec t;
  AlphaRec *p;
  char *pcStack_28;
  int len;
  char *r;
  char codeISO [8];
  char *territoryISO_local;
  int parentNumber_local;
  
  p._4_4_ = 0;
  if (parentNumber < 0) {
    territoryISO_local._4_4_ = TERRITORY_NONE;
  }
  else {
    pcStack_28 = territoryISO;
    codeISO = (char  [8])territoryISO;
    if (0 < parentNumber) {
      r._0_1_ = PARENTS_2[parentNumber * 3 + -3];
      r._1_1_ = PARENTS_2[parentNumber * 3 + -2];
      r._2_1_ = 0x2d;
      p._4_4_ = 3;
    }
    while( true ) {
      bVar1 = false;
      if (p._4_4_ < 7) {
        bVar1 = ' ' < *pcStack_28;
      }
      if (!bVar1) break;
      codeISO[(long)p._4_4_ + -8] = *pcStack_28;
      p._4_4_ = p._4_4_ + 1;
      pcStack_28 = pcStack_28 + 1;
    }
    if (*pcStack_28 < '!') {
      codeISO[(long)p._4_4_ + -8] = '\0';
      makeUppercase((char *)&r);
      local_48 = &r;
      t._8_8_ = bsearch(&local_48,ALPHA_SEARCH,0x394,0x10,compareAlphaCode);
      if (((undefined8 *)t._8_8_ == (undefined8 *)0x0) ||
         (iVar2 = strcmp((char *)local_48,*(char **)t._8_8_), iVar2 != 0)) {
        territoryISO_local._4_4_ = TERRITORY_NONE;
      }
      else {
        territoryISO_local._4_4_ = *(Territory *)(t._8_8_ + 8);
      }
    }
    else {
      territoryISO_local._4_4_ = TERRITORY_NONE;
    }
  }
  return territoryISO_local._4_4_;
}

Assistant:

static enum Territory findMatch(const int parentNumber, const char *territoryISO) {
    // build an uppercase search term
    char codeISO[MAX_ISOCODE_ASCII_LEN + 1];
    const char *r = territoryISO;
    int len = 0;
    ASSERT(territoryISO);

    if (parentNumber < 0) {
        return TERRITORY_NONE;
    }
    if (parentNumber > 0) {
        codeISO[0] = PARENTS_2[3 * parentNumber - 3];
        codeISO[1] = PARENTS_2[3 * parentNumber - 2];
        codeISO[2] = '-';
        len = 3;
    }
    while ((len < MAX_ISOCODE_ASCII_LEN) && (*r > 32)) {
        codeISO[len++] = *r++;
    }
    if (*r > 32) {
        return TERRITORY_NONE;
    }
    codeISO[len] = 0;
    makeUppercase(codeISO);
    { // binary-search the result
        const AlphaRec *p;
        AlphaRec t;
        t.alphaCode = codeISO;

        p = (const AlphaRec *) bsearch(&t, ALPHA_SEARCH, NR_TERRITORY_RECS, sizeof(AlphaRec), compareAlphaCode);
        if (p) {
            if (strcmp(t.alphaCode, p->alphaCode) == 0) { // only interested in PERFECT match
                return p->territory;
            } // match
        } // found
    } //
    return TERRITORY_NONE;
}